

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstrList * bsplits(bstring str,bstring splitStr)

{
  int iVar1;
  bstring local_38;
  genBstrList g;
  bstring splitStr_local;
  bstring str_local;
  
  if ((((str == (bstring)0x0) || (str->slen < 0)) || (str->data == (uchar *)0x0)) ||
     (((splitStr == (bstring)0x0 || (splitStr->slen < 0)) || (splitStr->data == (uchar *)0x0)))) {
    str_local = (bstring)0x0;
  }
  else {
    g.bl._0_4_ = 4;
    g._16_8_ = splitStr;
    g.b = (bstring)malloc(0x28);
    if (g.b == (bstring)0x0) {
      str_local = (bstring)0x0;
    }
    else {
      (g.b)->mlen = 0;
      local_38 = str;
      iVar1 = bsplitscb(str,(bstring)g._16_8_,0,bscb,&local_38);
      if (iVar1 < 0) {
        bstrListDestroy((bstrList *)g.b);
        str_local = (bstring)0x0;
      }
      else {
        str_local = g.b;
      }
    }
  }
  return (bstrList *)str_local;
}

Assistant:

struct bstrList * bsplits (const bstring str, const bstring splitStr) {
struct genBstrList g;

	if (     str == NULL ||      str->slen < 0 ||      str->data == NULL ||
	    splitStr == NULL || splitStr->slen < 0 || splitStr->data == NULL)
		return NULL;

	g.mlen = 4;
	g.bl = (struct bstrList *) bstr__alloc (BLE_SZ + sizeof (bstring) * g.mlen);
	if (g.bl == NULL) return NULL;
	g.b = str;
	g.bl->qty = 0;
	if (bsplitscb (str, splitStr, 0, bscb, &g) < 0) {
		bstrListDestroy (g.bl);
		return NULL;
	}
	return g.bl;
}